

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
opengv::math::Sturm::findRoots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Sturm *this)

{
  ulong uVar1;
  pointer pdVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  MatrixXd monomials;
  double *local_a0 [2];
  Index local_90;
  MatrixXd *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  MatrixXd *local_68;
  MatrixXd value;
  MatrixXd derivative;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bracketRoots(this,__return_storage_ptr__,-1.0);
  local_a0[0] = (double *)CONCAT44(local_a0[0]._4_4_,1);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&monomials,&this->_dimension,(int *)local_a0);
  monomials.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
  [this->_dimension - 1] = 1.0;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)(__return_storage_ptr__->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
      uVar1 = this->_dimension;
      pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar4 = monomials.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data + (uVar1 - 1);
      for (uVar5 = 2; uVar5 <= uVar1; uVar5 = uVar5 + 1) {
        pdVar4[-1] = *pdVar4 * pdVar2[uVar6];
        pdVar4 = pdVar4 + -1;
      }
      local_a0[0] = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
      local_90 = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols;
      local_80 = 0;
      uStack_78 = 0;
      local_70 = 1;
      local_88 = &this->_C;
      local_68 = &monomials;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&value,
                 (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                  *)local_a0);
      local_90 = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols;
      local_a0[0] = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + 1;
      local_80 = 1;
      uStack_78 = 0;
      local_70 = 1;
      local_88 = &this->_C;
      local_68 = &monomials;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&derivative,
                 (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                  *)local_a0);
      pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar2[uVar6] =
           pdVar2[uVar6] -
           *value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           / *derivative.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data;
      Eigen::internal::handmade_aligned_free
                (derivative.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
      Eigen::internal::handmade_aligned_free
                (value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data);
    }
  }
  Eigen::internal::handmade_aligned_free
            (monomials.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double>
opengv::math::Sturm::findRoots()
{
  //bracket the roots
  std::vector<double> roots;
  bracketRoots(roots);

  //pollish
  Eigen::MatrixXd monomials(_dimension,1);
  monomials(_dimension-1,0) = 1.0;

  for(size_t r = 0; r < roots.size(); r++ )
  {
    //Now do Gauss iterations here
    //evaluate all monomials at the left bound
    for(size_t k = 0; k < 5; k++ )
    {
      for(size_t i = 2; i <= _dimension; i++)
        monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*roots[r];

      Eigen::MatrixXd value = _C.row(0) * monomials;
      Eigen::MatrixXd derivative = _C.row(1) * monomials;

      //correction
      roots[r] = roots[r] - (value(0,0)/derivative(0,0));
    }
  }

  return roots;
}